

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directives.cpp
# Opt level: O2

void dirBPLIST(void)

{
  int iVar1;
  EBreakpointsFile type;
  path fName;
  
  if ((pass == 2) && (DeviceID != (char *)0x0)) {
    GetOutputFileName_abi_cxx11_(&fName,&lp);
    type = BPSF_UNREAL;
    iVar1 = cmphstr(&lp,"unreal",false);
    if (iVar1 == 0) {
      iVar1 = cmphstr(&lp,"zesarux",false);
      if (iVar1 == 0) {
        iVar1 = cmphstr(&lp,"mame",false);
        if (iVar1 == 0) {
          iVar1 = SkipBlanks();
          type = BPSF_UNREAL;
          if (iVar1 == 0) {
            Warning("[BPLIST] invalid breakpoints file type (use \"unreal\" or \"zesarux\")",lp,
                    W_EARLY);
          }
        }
        else {
          type = BPSF_MAME;
        }
      }
      else {
        type = BPSF_ZESARUX;
      }
    }
    OpenBreakpointsFile(&fName,type);
    std::filesystem::__cxx11::path::~path(&fName);
    return;
  }
  if (pass == 2) {
    Error("BPLIST only allowed in real device emulation mode (See DEVICE)",(char *)0x0,EARLY);
  }
  SkipToEol(&lp);
  return;
}

Assistant:

static void dirBPLIST() {
	// breakpoint file is opened in second pass, and content is written through third pass
	// so position of `BPLIST` directive in source does not matter
	// TODO requires extra guard in case of N-pass assembling to open the file only once
	if (2 != pass || !DeviceID) {	// nothing to do in first or last pass, second will open the file
		if (2 == pass) {	// !Device is true -> no device in second pass -> error
			Error("BPLIST only allowed in real device emulation mode (See DEVICE)", nullptr, EARLY);
		}
		SkipToEol(lp);
		return;
	}
	const std::filesystem::path fName = GetOutputFileName(lp);
	EBreakpointsFile type = BPSF_UNREAL;
	if (cmphstr(lp, "unreal")) {
		type = BPSF_UNREAL;
	} else if (cmphstr(lp, "zesarux")) {
		type = BPSF_ZESARUX;
	} else if (cmphstr(lp, "mame")) {
		type = BPSF_MAME;
	} else if (!SkipBlanks()) {
		Warning("[BPLIST] invalid breakpoints file type (use \"unreal\" or \"zesarux\")", lp, W_EARLY);
	}
	OpenBreakpointsFile(fName, type);
}